

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitHop.c
# Opt level: O3

int Kit_GraphToGiaInternal(Gia_Man_t *pMan,Kit_Graph_t *pGraph,int fHash)

{
  int iVar1;
  Kit_Node_t *pKVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  long lVar5;
  Gia_Obj_t *pGVar6;
  uint *puVar7;
  int *piVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint iLit1;
  ulong uVar17;
  uint iLit0;
  uint uVar18;
  
  if (pGraph->fConst == 0) {
    uVar13 = (ulong)(uint)pGraph->nLeaves;
    uVar10 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
    if (uVar10 < (uint)pGraph->nLeaves) {
      uVar10 = pGraph->pNodes[uVar10].field_2.iFunc;
      if ((int)uVar10 < 0) {
LAB_005da3df:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar4 = (uint)pGraph->eRoot & 1;
    }
    else {
      lVar16 = uVar13 * 0x18 + 8;
      do {
        pKVar2 = pGraph->pNodes;
        uVar10 = *(uint *)((long)pKVar2 + lVar16 + -8);
        uVar14 = pKVar2[uVar10 >> 1 & 0x3fffffff].field_2.iFunc;
        if ((int)uVar14 < 0) goto LAB_005da3df;
        uVar11 = *(uint *)((long)pKVar2 + lVar16 + -4);
        uVar18 = pKVar2[uVar11 >> 1 & 0x3fffffff].field_2.iFunc;
        if ((int)uVar18 < 0) goto LAB_005da3df;
        uVar10 = uVar10 & 1;
        iLit0 = uVar10 ^ uVar14;
        uVar11 = uVar11 & 1;
        iLit1 = uVar11 ^ uVar18;
        if (fHash == 0) {
          if (pMan->fGiaSimple == 0) {
            if (uVar14 < 2) {
              uVar4 = iLit1;
              if (uVar10 == uVar14) {
                uVar4 = 0;
              }
            }
            else {
              uVar4 = iLit0;
              if (uVar18 < 2) {
                if (uVar11 == uVar18) {
                  uVar4 = 0;
                }
              }
              else if ((iLit0 != iLit1) && (uVar4 = 0, (iLit1 ^ iLit0) != 1)) goto LAB_005d9e8c;
            }
          }
          else {
LAB_005d9e8c:
            uVar10 = pMan->nObjs;
            if (uVar10 == pMan->nObjsAlloc) {
              uVar11 = uVar10 * 2;
              if (0x1fffffff < (int)(uVar10 * 2)) {
                uVar11 = 0x20000000;
              }
              if (uVar10 == 0x20000000) {
                puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
                exit(1);
              }
              if ((int)uVar11 <= (int)uVar10) {
                __assert_fail("p->nObjs < nObjNew",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x288,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
              }
              if (pMan->fVerbose != 0) {
                printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar10,(ulong)uVar11);
                uVar10 = pMan->nObjsAlloc;
              }
              if ((int)uVar10 < 1) {
                __assert_fail("p->nObjsAlloc > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x28b,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
              }
              lVar5 = (long)(int)uVar11;
              if (pMan->pObjs == (Gia_Obj_t *)0x0) {
                pGVar6 = (Gia_Obj_t *)malloc(lVar5 * 0xc);
              }
              else {
                pGVar6 = (Gia_Obj_t *)realloc(pMan->pObjs,lVar5 * 0xc);
                uVar10 = pMan->nObjsAlloc;
              }
              pMan->pObjs = pGVar6;
              memset(pGVar6 + (int)uVar10,0,(long)(int)(uVar11 - uVar10) * 0xc);
              if (pMan->pMuxes != (uint *)0x0) {
                puVar7 = (uint *)realloc(pMan->pMuxes,lVar5 * 4);
                pMan->pMuxes = puVar7;
                memset(puVar7 + pMan->nObjsAlloc,0,(lVar5 - pMan->nObjsAlloc) * 4);
              }
              pMan->nObjsAlloc = uVar11;
            }
            if ((pMan->vHTable).nSize != 0) {
              uVar10 = (pMan->vHash).nSize;
              if (uVar10 == (pMan->vHash).nCap) {
                if ((int)uVar10 < 0x10) {
                  piVar8 = (pMan->vHash).pArray;
                  if (piVar8 == (int *)0x0) {
                    piVar8 = (int *)malloc(0x40);
                  }
                  else {
                    piVar8 = (int *)realloc(piVar8,0x40);
                  }
                  (pMan->vHash).pArray = piVar8;
                  if (piVar8 == (int *)0x0) {
LAB_005da4ed:
                    __assert_fail("p->pArray",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                  ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
                  }
                  (pMan->vHash).nCap = 0x10;
                }
                else {
                  piVar8 = (pMan->vHash).pArray;
                  if (piVar8 == (int *)0x0) {
                    piVar8 = (int *)malloc((ulong)uVar10 * 8);
                  }
                  else {
                    piVar8 = (int *)realloc(piVar8,(ulong)uVar10 * 8);
                  }
                  (pMan->vHash).pArray = piVar8;
                  if (piVar8 == (int *)0x0) goto LAB_005da4ed;
                  (pMan->vHash).nCap = uVar10 * 2;
                }
              }
              else {
                piVar8 = (pMan->vHash).pArray;
              }
              iVar1 = (pMan->vHash).nSize;
              (pMan->vHash).nSize = iVar1 + 1;
              piVar8[iVar1] = 0;
            }
            iVar1 = pMan->nObjs;
            uVar10 = iVar1 + 1;
            pMan->nObjs = uVar10;
            if ((long)iVar1 < 0) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            uVar14 = uVar14 >> 1;
            if (uVar10 <= uVar14) {
              __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
            }
            uVar18 = uVar18 >> 1;
            if (uVar10 <= uVar18) {
              __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
            }
            pGVar6 = pMan->pObjs + iVar1;
            if ((uVar14 == uVar18) && (pMan->fGiaSimple == 0)) {
              __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
            }
            uVar10 = iVar1 - uVar14 & 0x1fffffff;
            uVar17 = *(ulong *)pGVar6;
            if (iLit0 < iLit1) {
              uVar9 = (ulong)(uVar10 | (iLit0 & 1) << 0x1d);
              *(ulong *)pGVar6 = uVar9 | uVar17 & 0xffffffffc0000000;
              pGVar3 = pMan->pObjs;
              if ((pGVar6 < pGVar3) || (pGVar3 + pMan->nObjs <= pGVar6)) goto LAB_005da3fe;
              uVar9 = uVar9 | uVar17 & 0xc0000000c0000000;
              uVar17 = (ulong)(iLit1 & 1) << 0x3d |
                       (ulong)(((uint)((int)pGVar6 - (int)pGVar3) >> 2) * -0x55555555 - uVar18 &
                              0x1fffffff) << 0x20;
            }
            else {
              uVar12 = (ulong)uVar10 << 0x20;
              uVar15 = (ulong)(iLit0 & 1) << 0x3d;
              *(ulong *)pGVar6 = uVar15 | uVar17 & 0xc0000000ffffffff | uVar12;
              pGVar3 = pMan->pObjs;
              if ((pGVar6 < pGVar3) || (pGVar3 + pMan->nObjs <= pGVar6)) goto LAB_005da3fe;
              uVar9 = (ulong)(((uint)((int)pGVar6 - (int)pGVar3) >> 2) * -0x55555555 - uVar18 &
                             0x1fffffff);
              uVar17 = (ulong)((iLit1 & 1) << 0x1d) | uVar15 | uVar17 & 0xc0000000c0000000 | uVar12;
            }
            *(ulong *)pGVar6 = uVar17 | uVar9;
            if (pMan->pFanData != (int *)0x0) {
              Gia_ObjAddFanout(pMan,pGVar6 + -(uVar9 & 0x1fffffff),pGVar6);
              Gia_ObjAddFanout(pMan,pGVar6 + -((ulong)*(uint *)&pGVar6->field_0x4 & 0x1fffffff),
                               pGVar6);
            }
            if (pMan->fSweeper != 0) {
              uVar12 = *(ulong *)pGVar6 & 0x1fffffff;
              uVar17 = *(ulong *)pGVar6 >> 0x20 & 0x1fffffff;
              uVar15 = 0x4000000000000000;
              if (((uint)*(ulong *)(pGVar6 + -uVar12) >> 0x1e & 1) == 0) {
                uVar15 = 0x40000000;
              }
              *(ulong *)(pGVar6 + -uVar12) = uVar15 | *(ulong *)(pGVar6 + -uVar12);
              uVar15 = *(ulong *)(pGVar6 + -uVar17);
              uVar9 = 0x4000000000000000;
              if (((uint)uVar15 >> 0x1e & 1) == 0) {
                uVar9 = 0x40000000;
              }
              *(ulong *)(pGVar6 + -uVar17) = uVar9 | uVar15;
              uVar17 = *(ulong *)pGVar6;
              *(ulong *)pGVar6 =
                   uVar17 & 0x7fffffffffffffff |
                   (ulong)(((uint)(uVar17 >> 0x3d) ^ (uint)(uVar15 >> 0x3f)) &
                          ((uint)((ulong)*(undefined8 *)(pGVar6 + -uVar12) >> 0x3f) ^
                          (uint)(uVar17 >> 0x1d) & 7)) << 0x3f;
            }
            if (pMan->fBuiltInSim != 0) {
              uVar17 = *(ulong *)pGVar6;
              *(ulong *)pGVar6 =
                   uVar17 & 0x7fffffffffffffff |
                   (ulong)(((uint)(uVar17 >> 0x3d) ^
                           (uint)((ulong)*(undefined8 *)(pGVar6 + -(uVar17 >> 0x20 & 0x1fffffff)) >>
                                 0x3f)) &
                          ((uint)((ulong)*(undefined8 *)(pGVar6 + -(uVar17 & 0x1fffffff)) >> 0x3f) ^
                          (uint)(uVar17 >> 0x1d) & 7)) << 0x3f;
              pGVar3 = pMan->pObjs;
              if ((pGVar6 < pGVar3) || (pGVar3 + pMan->nObjs <= pGVar6)) goto LAB_005da3fe;
              Gia_ManBuiltInSimPerform
                        (pMan,(int)((ulong)((long)pGVar6 - (long)pGVar3) >> 2) * -0x55555555);
            }
            if (pMan->vSuppWords != (Vec_Wrd_t *)0x0) {
              Gia_ManQuantSetSuppAnd(pMan,pGVar6);
            }
            pGVar3 = pMan->pObjs;
            if ((pGVar6 < pGVar3) || (pGVar3 + pMan->nObjs <= pGVar6)) {
LAB_005da3fe:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar4 = (int)((ulong)((long)pGVar6 - (long)pGVar3) >> 2) * 0x55555556;
          }
        }
        else {
          uVar4 = Gia_ManHashAnd(pMan,iLit0,iLit1);
        }
        *(uint *)(&(pKVar2->eEdge0).field_0x0 + lVar16) = uVar4;
        uVar13 = uVar13 + 1;
        lVar16 = lVar16 + 0x18;
      } while ((long)uVar13 < (long)pGraph->nSize);
      if ((int)uVar4 < 0) goto LAB_005da3df;
      uVar10 = (uint)pGraph->eRoot & 1;
    }
    uVar10 = uVar10 ^ uVar4;
  }
  else {
    uVar10 = ~(uint)pGraph->eRoot & 1;
  }
  return uVar10;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Transforms the decomposition graph into the AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Kit_GraphToGiaInternal( Gia_Man_t * pMan, Kit_Graph_t * pGraph, int fHash )
{
    Kit_Node_t * pNode = NULL;
    int i, pAnd0, pAnd1;
    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Abc_LitNotCond( 1, Kit_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Abc_LitNotCond( Kit_GraphVar(pGraph)->iFunc, Kit_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Abc_LitNotCond( Kit_GraphNode(pGraph, pNode->eEdge0.Node)->iFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Abc_LitNotCond( Kit_GraphNode(pGraph, pNode->eEdge1.Node)->iFunc, pNode->eEdge1.fCompl ); 
        if ( fHash )
            pNode->iFunc = Gia_ManHashAnd( pMan, pAnd0, pAnd1 );
        else
            pNode->iFunc = Gia_ManAppendAnd2( pMan, pAnd0, pAnd1 );
    }
    // complement the result if necessary
    return Abc_LitNotCond( pNode->iFunc, Kit_GraphIsComplement(pGraph) );
}